

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,U32 nbDmers,U32 k,U32 passes)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = k * 10;
  uVar2 = 1;
  if (passes <= (uint)((ulong)maxDictSize / (ulong)k)) {
    uVar2 = ((ulong)maxDictSize / (ulong)k) / (ulong)passes;
  }
  uVar3 = nbDmers / uVar2;
  if ((uint)uVar3 < uVar1) {
    if (nbDmers <= uVar1) {
      uVar1 = nbDmers;
    }
    uVar3 = (ulong)uVar1;
    uVar2 = nbDmers / uVar3;
    if (nbDmers < (int)uVar2 * uVar1) {
      __assert_fail("epochs.size * epochs.num <= nbDmers",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb232,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
    }
  }
  else if (nbDmers < (uint)uVar3 * (int)uVar2) {
    __assert_fail("epochs.size * epochs.num <= nbDmers",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb22d,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
  }
  return (COVER_epoch_info_t)(uVar2 | uVar3 << 0x20);
}

Assistant:

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,
                                       U32 nbDmers, U32 k, U32 passes)
{
  const U32 minEpochSize = k * 10;
  COVER_epoch_info_t epochs;
  epochs.num = MAX(1, maxDictSize / k / passes);
  epochs.size = nbDmers / epochs.num;
  if (epochs.size >= minEpochSize) {
      assert(epochs.size * epochs.num <= nbDmers);
      return epochs;
  }
  epochs.size = MIN(minEpochSize, nbDmers);
  epochs.num = nbDmers / epochs.size;
  assert(epochs.size * epochs.num <= nbDmers);
  return epochs;
}